

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int compound_skip_get_candidates
              (AV1_COMP *cpi,InterModeSearchState *search_state,int dir,PREDICTION_MODE mode)

{
  int iVar1;
  SingleInterModeState (*paSVar2) [4];
  SingleInterModeState (*paSVar3) [4];
  int local_44;
  int local_40;
  int candidates;
  int i;
  int max_candidates;
  SingleInterModeState *state_modelled;
  SingleInterModeState *state;
  int mode_offset;
  PREDICTION_MODE mode_local;
  int dir_local;
  InterModeSearchState *search_state_local;
  AV1_COMP *cpi_local;
  
  iVar1 = mode - 0xd;
  paSVar2 = search_state->single_state[dir] + iVar1;
  paSVar3 = search_state->single_state_modelled[dir] + iVar1;
  max_candidates = 0;
  for (i = 0; (i < 4 && (search_state->single_rd_order[dir][iVar1][i] != -1)); i = i + 1) {
    max_candidates = max_candidates + 1;
  }
  candidates = max_candidates;
  if (1 < (cpi->sf).inter_sf.prune_comp_search_by_single_result) {
    if (max_candidates < 3) {
      local_40 = max_candidates;
    }
    else {
      local_40 = 2;
    }
    candidates = local_40;
  }
  if (2 < (cpi->sf).inter_sf.prune_comp_search_by_single_result) {
    if ((((*paSVar2)[0].rd != 0x7fffffffffffffff) && ((*paSVar3)[0].rd != 0x7fffffffffffffff)) &&
       ((*paSVar2)[0].ref_frame == (*paSVar3)[0].ref_frame)) {
      candidates = 1;
    }
    if ((mode == '\x0e') || (mode == '\x0f')) {
      candidates = 1;
    }
  }
  if (3 < (cpi->sf).inter_sf.prune_comp_search_by_single_result) {
    if (candidates < 2) {
      local_44 = candidates;
    }
    else {
      local_44 = 1;
    }
    candidates = local_44;
  }
  return candidates;
}

Assistant:

static int compound_skip_get_candidates(
    const AV1_COMP *cpi, const InterModeSearchState *search_state,
    const int dir, const PREDICTION_MODE mode) {
  const int mode_offset = INTER_OFFSET(mode);
  const SingleInterModeState *state =
      search_state->single_state[dir][mode_offset];
  const SingleInterModeState *state_modelled =
      search_state->single_state_modelled[dir][mode_offset];

  int max_candidates = 0;
  for (int i = 0; i < FWD_REFS; ++i) {
    if (search_state->single_rd_order[dir][mode_offset][i] == NONE_FRAME) break;
    max_candidates++;
  }

  int candidates = max_candidates;
  if (cpi->sf.inter_sf.prune_comp_search_by_single_result >= 2) {
    candidates = AOMMIN(2, max_candidates);
  }
  if (cpi->sf.inter_sf.prune_comp_search_by_single_result >= 3) {
    if (state[0].rd != INT64_MAX && state_modelled[0].rd != INT64_MAX &&
        state[0].ref_frame == state_modelled[0].ref_frame)
      candidates = 1;
    if (mode == NEARMV || mode == GLOBALMV) candidates = 1;
  }

  if (cpi->sf.inter_sf.prune_comp_search_by_single_result >= 4) {
    // Limit the number of candidates to 1 in each direction for compound
    // prediction
    candidates = AOMMIN(1, candidates);
  }
  return candidates;
}